

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O0

_Bool utf8_reverse(char *p)

{
  uint uVar1;
  byte *pbVar2;
  bool bVar3;
  byte *local_20;
  char *q;
  char *p_local;
  
  string_reverse(p);
  local_20 = (byte *)p;
  while( true ) {
    bVar3 = false;
    if (local_20 != (byte *)0x0) {
      bVar3 = *local_20 != 0;
    }
    pbVar2 = local_20;
    if (!bVar3) break;
    local_20 = local_20 + 1;
  }
  while( true ) {
    while( true ) {
      local_20 = pbVar2;
      pbVar2 = local_20 + -1;
      if (pbVar2 <= p) {
        return true;
      }
      uVar1 = (uint)(*pbVar2 >> 4);
      if (uVar1 - 0xc < 2) break;
      if (uVar1 == 0xe) {
        if ((long)pbVar2 - (long)p < 3) {
          return false;
        }
        *pbVar2 = *pbVar2 ^ local_20[-3];
        local_20[-3] = local_20[-3] ^ *pbVar2;
        *pbVar2 = *pbVar2 ^ local_20[-3];
        pbVar2 = local_20 + -3;
      }
      else if (uVar1 == 0xf) {
        if ((long)pbVar2 - (long)p < 4) {
          return false;
        }
        *pbVar2 = *pbVar2 ^ local_20[-4];
        local_20[-4] = local_20[-4] ^ *pbVar2;
        *pbVar2 = *pbVar2 ^ local_20[-4];
        local_20[-2] = local_20[-2] ^ local_20[-3];
        local_20[-3] = local_20[-3] ^ local_20[-2];
        local_20[-2] = local_20[-2] ^ local_20[-3];
        pbVar2 = local_20 + -4;
      }
    }
    if ((long)pbVar2 - (long)p < 1) break;
    *pbVar2 = *pbVar2 ^ local_20[-2];
    local_20[-2] = local_20[-2] ^ *pbVar2;
    *pbVar2 = *pbVar2 ^ local_20[-2];
    pbVar2 = local_20 + -2;
  }
  return false;
}

Assistant:

bool utf8_reverse (char *p) {
    char *q = p;
    string_reverse(p);
    
    // now fix bass-ackwards UTF chars.
    while(q && *q) ++q; // find eos
    while(p < --q)
        switch( (*q & 0xF0) >> 4 ) {
            case 0xF: /* U+010000-U+10FFFF: four bytes. */
                if (q-p < 4) return false;
                SWP(*(q-0), *(q-3));
                SWP(*(q-1), *(q-2));
                q -= 3;
                break;
            case 0xE: /* U+000800-U+00FFFF: three bytes. */
                if (q-p < 3) return false;
                SWP(*(q-0), *(q-2));
                q -= 2;
                break;
            case 0xC: /* fall-through */
            case 0xD: /* U+000080-U+0007FF: two bytes. */
                if (q-p < 1) return false;
                SWP(*(q-0), *(q-1));
                q--;
                break;
        }
    return true;
}